

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void SHUFF_OUTPUT_ULONG(bit_io_t *bio,uint64_t n,char len)

{
  byte in_DL;
  ulong in_RSI;
  bit_io_t *in_RDI;
  
  if ((ulong)(long)(char)in_DL < in_RDI->buff_btg) {
    *in_RDI->out_u64 = *in_RDI->out_u64 << (in_DL & 0x3f);
    *in_RDI->out_u64 = in_RSI | *in_RDI->out_u64;
    in_RDI->buff_btg = in_RDI->buff_btg - (long)(char)in_DL;
  }
  else {
    *in_RDI->out_u64 = *in_RDI->out_u64 << ((byte)in_RDI->buff_btg & 0x3f);
    *in_RDI->out_u64 = in_RSI >> (in_DL - (char)in_RDI->buff_btg & 0x3f) | *in_RDI->out_u64;
    SHUFF_OUTPUT_NEXT(in_RDI);
    *in_RDI->out_u64 = in_RSI;
    in_RDI->buff_btg = 0x40 - ((long)(char)in_DL - in_RDI->buff_btg);
  }
  return;
}

Assistant:

inline void SHUFF_OUTPUT_ULONG(bit_io_t* bio, uint64_t n, char len)
{
    if (len < bio->buff_btg) {
        *bio->out_u64 <<= len;
        *bio->out_u64 |= n;
        bio->buff_btg -= len;
    } else {
        *bio->out_u64 <<= bio->buff_btg;
        *bio->out_u64 |= (n) >> (len - bio->buff_btg);
        SHUFF_OUTPUT_NEXT(bio);
        *bio->out_u64 = n;
        bio->buff_btg = SHUFF_BUFF_BITS - (len - bio->buff_btg);
    }
}